

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_average_down_faces
               (Array<const_MultiFab_*,_3> *fine,Array<MultiFab_*,_3> *crse,IntVect *ratio,
               int ngcrse)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  const_reference ppMVar14;
  FabFactory<amrex::FArrayBox> *pFVar15;
  const_reference ppMVar16;
  uint in_ECX;
  Array<MultiFab_*,_3> *in_RDX;
  Array<const_MultiFab_*,_3> *in_RSI;
  int idim_1;
  BoxArray cba;
  int idim;
  Array<MultiFab,_3> ctmp;
  int i_5;
  int j_5;
  int k_5;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int i_4;
  int j_4;
  int k_4;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i_3;
  int j_3;
  int k_3;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *ap;
  Box b;
  iterator __end7;
  iterator __begin7;
  range_impl<amrex::Box> *__range7;
  Array4<const_double> *fa;
  Array4<double> *ca;
  Box result;
  FabType typ;
  Box *tbx;
  EBCellFlagFab *flag_fab;
  MFIter mfi;
  int n;
  Array<const_MultiCutFab_*,_3> *aspect;
  EBFArrayBoxFactory *factory;
  Dim3 dratio;
  int ncomp;
  int iref_1;
  int jref_1;
  Real c_2;
  int kk_2;
  int jj_2;
  int ii_2;
  int i_2;
  int j_2;
  int k_2;
  int n_3;
  Real facInv_2;
  int iref;
  int kref_1;
  Real c_1;
  int kk_1;
  int jj_1;
  int ii_1;
  int i_1;
  int j_1;
  int k_1;
  int n_2;
  Real facInv_1;
  int jref;
  int kref;
  Real c;
  int kk;
  int jj;
  int ii;
  int i;
  int j;
  int k;
  int n_1;
  Real facInv;
  int facz;
  int facy;
  int facx;
  Dim3 chi;
  Dim3 clo;
  Real tmp;
  int jj_3;
  int kk_3;
  Real a;
  Real c_3;
  int n_4;
  int ii_3;
  Real tmp_1;
  int ii_4;
  int kk_4;
  Real a_1;
  Real c_4;
  int n_5;
  int jj_4;
  Real tmp_2;
  int ii_5;
  int jj_5;
  Real a_2;
  Real c_5;
  int n_6;
  int kk_5;
  IntVect shft;
  BoxArray *in_stack_ffffffffffffed58;
  undefined4 uVar17;
  MultiCutFab *in_stack_ffffffffffffed60;
  undefined4 in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed6c;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffed70;
  undefined4 in_stack_ffffffffffffed84;
  FabArrayBase *in_stack_ffffffffffffed88;
  MFIter *in_stack_ffffffffffffed90;
  reference in_stack_ffffffffffffeda0;
  BoxArray *in_stack_ffffffffffffeda8;
  uint in_stack_ffffffffffffedb0;
  uint in_stack_ffffffffffffedb4;
  undefined1 *in_stack_ffffffffffffedb8;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffedc0;
  Box *__return_storage_ptr__;
  undefined4 in_stack_ffffffffffffedc8;
  int in_stack_ffffffffffffedcc;
  EBCellFlagFab *in_stack_ffffffffffffedd0;
  undefined8 in_stack_ffffffffffffede0;
  undefined7 in_stack_ffffffffffffede8;
  undefined1 in_stack_ffffffffffffedef;
  undefined8 in_stack_ffffffffffffedf0;
  int local_11ec;
  BATransformer local_11d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffee80;
  EBCellFlagFab *in_stack_ffffffffffffee88;
  int local_1134;
  int local_cac;
  int local_ca8;
  int local_ca4;
  int local_c64;
  int local_c60;
  int local_c5c;
  int local_c1c;
  int local_c18;
  int local_c14;
  long local_bd0;
  long local_bc8;
  long local_bc0;
  int local_bb0;
  int local_bac;
  int local_ba8;
  long *local_b90;
  Box local_b84;
  iterator local_b68;
  iterator local_b50;
  undefined1 local_b38 [40];
  undefined1 *local_b10;
  long local_b08 [8];
  long *local_ac8;
  long local_ac0 [8];
  long *local_a80;
  undefined1 local_a74 [12];
  undefined1 auStack_a68 [12];
  uint local_a5c;
  FabType local_a58;
  int local_a54 [6];
  uint local_a3c;
  int *local_a38;
  EBCellFlagFab *local_a20;
  MFIter local_a18;
  int local_9b4;
  undefined1 local_9b0 [24];
  undefined1 *local_998;
  long local_990;
  MultiFab *local_988;
  int local_980;
  undefined8 local_974;
  int ngcrse_00;
  int local_820;
  int local_81c;
  double local_818;
  int local_800;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  int local_7e8;
  int local_7e4;
  double local_7e0;
  int local_7c8;
  int local_7c4;
  int local_7c0;
  int local_7bc;
  int local_7b0;
  int local_7ac;
  double local_7a8;
  int local_790;
  int local_78c;
  int local_788;
  int local_784;
  int local_658;
  int local_654;
  double local_650;
  double local_648;
  int local_63c;
  int local_5a0;
  int local_59c;
  double local_598;
  double local_590;
  int local_584;
  int local_4e8;
  int local_4e4;
  double local_4e0;
  double local_4d8;
  int local_4cc;
  int local_1a0;
  int iStack_19c;
  int local_198;
  IntVect local_194;
  Array<MultiFab_*,_3> *local_188;
  undefined1 *local_180;
  undefined4 local_174;
  int local_168 [2];
  int local_160;
  uint *local_158;
  IntVect local_14c;
  IntVect *local_140;
  undefined1 *local_138;
  undefined4 local_12c;
  IntVect *local_128;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  int *local_100;
  IntVect *local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  undefined4 local_cc;
  int *local_c8;
  Array<MultiFab_*,_3> *local_c0;
  undefined1 *local_b8;
  undefined4 local_ac;
  Array<MultiFab_*,_3> *local_a8;
  undefined4 local_9c;
  Array<MultiFab_*,_3> *local_98;
  undefined4 local_8c;
  Array<MultiFab_*,_3> *local_88;
  Array<MultiFab_*,_3> *local_80;
  undefined1 *local_78;
  undefined4 local_6c;
  Array<MultiFab_*,_3> *local_68;
  undefined4 local_5c;
  Array<MultiFab_*,_3> *local_58;
  undefined4 local_4c;
  Array<MultiFab_*,_3> *local_48;
  IntVect *local_40;
  undefined1 *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  ppMVar14 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                       ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
                        (size_type)in_stack_ffffffffffffed58);
  uVar12 = FabArrayBase::nComp((FabArrayBase *)*ppMVar14);
  std::array<const_amrex::MultiFab_*,_3UL>::operator[]
            ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
             (size_type)in_stack_ffffffffffffed58);
  bVar11 = FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_ffffffffffffed70);
  if (bVar11) {
    local_988 = in_RDX->_M_elems[0];
    local_980 = *(int *)(in_RDX->_M_elems + 1);
    local_974 = local_988;
    ngcrse_00 = local_980;
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
               (size_type)in_stack_ffffffffffffed58);
    pFVar15 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x13e9c44);
    local_990 = __dynamic_cast(pFVar15,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
    if (local_990 == 0) {
      __cxa_bad_cast();
    }
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffed60);
    local_998 = local_9b0;
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
               (size_type)in_stack_ffffffffffffed58);
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
               (size_type)in_stack_ffffffffffffed58);
    bVar11 = isMFIterSafe(&in_stack_ffffffffffffed70->super_FabArrayBase,
                          (FabArrayBase *)
                          CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
    if (bVar11) {
      for (local_9b4 = 0; local_9b4 < 3; local_9b4 = local_9b4 + 1) {
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
                   (size_type)in_stack_ffffffffffffed58);
        TilingIfNotGPU();
        MFIter::MFIter(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88,
                       SUB41((uint)in_stack_ffffffffffffed84 >> 0x18,0));
        while (bVar11 = MFIter::isValid(&local_a18), bVar11) {
          std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
                     (size_type)in_stack_ffffffffffffed58);
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffed60,
                     (MFIter *)in_stack_ffffffffffffed58);
          local_a20 = getEBCellFlagFab((FArrayBox *)in_stack_ffffffffffffed60);
          MFIter::growntilebox((MFIter *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedcc);
          local_a38 = local_a54;
          local_a5c = local_a3c;
          local_174 = 1;
          bVar11 = true;
          if ((*(int *)in_RDX->_M_elems == 1) &&
             (bVar11 = true, *(int *)((long)in_RDX->_M_elems + 4) == 1)) {
            bVar11 = *(int *)(in_RDX->_M_elems + 1) != 1;
          }
          in_stack_ffffffffffffedd0 = local_a20;
          local_180 = local_a74;
          if (bVar11) {
            local_188 = in_RDX;
            IntVect::IntVect(&local_194,1);
            local_158 = &local_a5c;
            IntVect::IntVect(&local_14c,local_a5c & 1,local_a5c >> 1 & 1,local_a5c >> 2 & 1);
            local_160 = local_14c.vect[2];
            local_168[0] = local_14c.vect[0];
            local_168[1] = local_14c.vect[1];
            local_1a0 = local_14c.vect[0];
            iStack_19c = local_14c.vect[1];
            uVar10 = _local_1a0;
            local_198 = local_14c.vect[2];
            local_f8 = &local_194;
            local_100 = &local_1a0;
            local_cc = 0;
            local_1a0 = local_14c.vect[0];
            local_194.vect[0] = local_194.vect[0] - local_1a0;
            local_dc = 1;
            iStack_19c = local_14c.vect[1];
            local_194.vect[1] = local_194.vect[1] - iStack_19c;
            local_ec = 2;
            local_194.vect[2] = local_194.vect[2] - local_14c.vect[2];
            local_80 = local_188;
            local_48 = local_188;
            local_4c = 0;
            local_58 = local_188;
            local_5c = 1;
            local_68 = local_188;
            local_6c = 2;
            local_38 = auStack_a68;
            local_40 = &local_194;
            local_c = 0;
            local_1c = 1;
            local_2c = 2;
            local_b8 = auStack_a68;
            local_c0 = local_188;
            local_88 = local_188;
            local_8c = 0;
            local_98 = local_188;
            local_9c = 1;
            local_a8 = local_188;
            local_ac = 2;
            local_138 = auStack_a68;
            local_140 = &local_194;
            local_10c = 0;
            local_11c = 1;
            local_12c = 2;
            _local_1a0 = uVar10;
            local_128 = local_140;
            local_118 = local_140;
            local_108 = local_140;
            local_e8 = local_100;
            local_d8 = local_100;
            local_c8 = local_100;
            local_78 = local_a74;
            local_28 = local_40;
            local_18 = local_40;
            local_8 = local_40;
          }
          local_a58 = EBCellFlagFab::getType
                                (in_stack_ffffffffffffee88,(Box *)in_stack_ffffffffffffee80._M_pi);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
                     (size_type)in_stack_ffffffffffffed58);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),
                     (MFIter *)in_stack_ffffffffffffed60);
          local_a80 = local_ac0;
          std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
                     (size_type)in_stack_ffffffffffffed58);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),
                     (MFIter *)in_stack_ffffffffffffed60);
          local_ac8 = local_b08;
          if ((local_a58 == regular) || (local_a58 == covered)) {
            Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffed60);
            local_b10 = local_b38;
            Gpu::range_detail::range_impl<amrex::Box>::begin
                      ((range_impl<amrex::Box> *)in_stack_ffffffffffffed60);
            Gpu::range_detail::range_impl<amrex::Box>::end
                      ((range_impl<amrex::Box> *)in_stack_ffffffffffffed60);
            while (bVar11 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                      (&local_b50,&local_b68), bVar11) {
              __return_storage_ptr__ = &local_b84;
              Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                        (__return_storage_ptr__,&local_b50);
              iVar2 = (__return_storage_ptr__->smallend).vect[0];
              iVar3 = (__return_storage_ptr__->smallend).vect[1];
              iVar4 = (__return_storage_ptr__->smallend).vect[2];
              iVar5 = (__return_storage_ptr__->bigend).vect[0];
              iVar6 = (__return_storage_ptr__->bigend).vect[1];
              iVar13 = (__return_storage_ptr__->bigend).vect[2];
              iVar7 = *(int *)in_RDX->_M_elems;
              iVar8 = *(int *)((long)in_RDX->_M_elems + 4);
              iVar9 = *(int *)(in_RDX->_M_elems + 1);
              if (local_9b4 == 0) {
                for (local_784 = 0; local_788 = iVar4, local_784 < (int)uVar12;
                    local_784 = local_784 + 1) {
                  for (; local_78c = iVar3, local_788 <= iVar13; local_788 = local_788 + 1) {
                    for (; local_790 = iVar2, local_78c <= iVar6; local_78c = local_78c + 1) {
                      for (; local_790 <= iVar5; local_790 = local_790 + 1) {
                        local_7a8 = 0.0;
                        for (local_7ac = 0; local_7ac < iVar9; local_7ac = local_7ac + 1) {
                          for (local_7b0 = 0; local_7b0 < iVar8; local_7b0 = local_7b0 + 1) {
                            local_7a8 = *(double *)
                                         (*local_ac8 +
                                         ((long)(local_790 * iVar7 - (int)local_ac8[4]) +
                                          (long)((local_78c * iVar8 + local_7b0) -
                                                *(int *)((long)local_ac8 + 0x24)) * local_ac8[1] +
                                          (long)((local_788 * iVar9 + local_7ac) - (int)local_ac8[5]
                                                ) * local_ac8[2] + (long)local_784 * local_ac8[3]) *
                                         8) + local_7a8;
                          }
                        }
                        *(double *)
                         (*local_a80 +
                         ((long)(local_790 - (int)local_a80[4]) +
                          (long)(local_78c - *(int *)((long)local_a80 + 0x24)) * local_a80[1] +
                          (long)(local_788 - (int)local_a80[5]) * local_a80[2] +
                         (long)local_784 * local_a80[3]) * 8) =
                             local_7a8 * (1.0 / (double)(iVar8 * iVar9));
                      }
                    }
                  }
                }
              }
              else if (local_9b4 == 1) {
                for (local_7bc = 0; local_7c0 = iVar4, local_7bc < (int)uVar12;
                    local_7bc = local_7bc + 1) {
                  for (; local_7c4 = iVar3, local_7c0 <= iVar13; local_7c0 = local_7c0 + 1) {
                    for (; local_7c8 = iVar2, local_7c4 <= iVar6; local_7c4 = local_7c4 + 1) {
                      for (; local_7c8 <= iVar5; local_7c8 = local_7c8 + 1) {
                        local_7e0 = 0.0;
                        for (local_7e4 = 0; local_7e4 < iVar9; local_7e4 = local_7e4 + 1) {
                          for (local_7e8 = 0; local_7e8 < iVar7; local_7e8 = local_7e8 + 1) {
                            local_7e0 = *(double *)
                                         (*local_ac8 +
                                         ((long)((local_7c8 * iVar7 + local_7e8) - (int)local_ac8[4]
                                                ) + (long)(local_7c4 * iVar8 -
                                                          *(int *)((long)local_ac8 + 0x24)) *
                                                    local_ac8[1] +
                                          (long)((local_7c0 * iVar9 + local_7e4) - (int)local_ac8[5]
                                                ) * local_ac8[2] + (long)local_7bc * local_ac8[3]) *
                                         8) + local_7e0;
                          }
                        }
                        *(double *)
                         (*local_a80 +
                         ((long)(local_7c8 - (int)local_a80[4]) +
                          (long)(local_7c4 - *(int *)((long)local_a80 + 0x24)) * local_a80[1] +
                          (long)(local_7c0 - (int)local_a80[5]) * local_a80[2] +
                         (long)local_7bc * local_a80[3]) * 8) =
                             local_7e0 * (1.0 / (double)(iVar7 * iVar9));
                      }
                    }
                  }
                }
              }
              else if (local_9b4 == 2) {
                for (local_7f4 = 0; local_7f8 = iVar4, local_7f4 < (int)uVar12;
                    local_7f4 = local_7f4 + 1) {
                  for (; local_7fc = iVar3, local_7f8 <= iVar13; local_7f8 = local_7f8 + 1) {
                    for (; local_800 = iVar2, local_7fc <= iVar6; local_7fc = local_7fc + 1) {
                      for (; local_800 <= iVar5; local_800 = local_800 + 1) {
                        local_818 = 0.0;
                        for (local_81c = 0; local_81c < iVar8; local_81c = local_81c + 1) {
                          for (local_820 = 0; local_820 < iVar7; local_820 = local_820 + 1) {
                            local_818 = *(double *)
                                         (*local_ac8 +
                                         ((long)((local_800 * iVar7 + local_820) - (int)local_ac8[4]
                                                ) + (long)((local_7fc * iVar8 + local_81c) -
                                                          *(int *)((long)local_ac8 + 0x24)) *
                                                    local_ac8[1] +
                                          (long)(local_7f8 * iVar9 - (int)local_ac8[5]) *
                                          local_ac8[2] + (long)local_7f4 * local_ac8[3]) * 8) +
                                        local_818;
                          }
                        }
                        *(double *)
                         (*local_a80 +
                         ((long)(local_800 - (int)local_a80[4]) +
                          (long)(local_7fc - *(int *)((long)local_a80 + 0x24)) * local_a80[1] +
                          (long)(local_7f8 - (int)local_a80[5]) * local_a80[2] +
                         (long)local_7f4 * local_a80[3]) * 8) =
                             local_818 * (1.0 / (double)(iVar7 * iVar8));
                      }
                    }
                  }
                }
              }
              in_stack_ffffffffffffedcc = local_9b4;
              Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_b50);
            }
          }
          else {
            std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffed60,
                       (size_type)in_stack_ffffffffffffed58);
            MultiCutFab::const_array(in_stack_ffffffffffffed60,(MFIter *)in_stack_ffffffffffffed58);
            local_b90 = &local_bd0;
            if (local_9b4 == 0) {
              iVar2 = *local_a38;
              iVar3 = local_a38[1];
              iVar4 = local_a38[3];
              iVar5 = local_a38[4];
              iVar6 = local_a38[5];
              for (local_c14 = local_a38[2]; local_c18 = iVar3, local_c14 <= iVar6;
                  local_c14 = local_c14 + 1) {
                for (; local_c1c = iVar2, local_c18 <= iVar5; local_c18 = local_c18 + 1) {
                  for (; local_c1c <= iVar4; local_c1c = local_c1c + 1) {
                    iVar13 = local_c1c * (int)local_974;
                    for (local_63c = 0; local_63c < (int)uVar12; local_63c = local_63c + 1) {
                      local_648 = 0.0;
                      local_650 = 0.0;
                      for (local_654 = local_c14 * ngcrse_00;
                          local_654 < (local_c14 + 1) * ngcrse_00; local_654 = local_654 + 1) {
                        for (local_658 = local_c18 * local_974._4_4_;
                            local_658 < (local_c18 + 1) * local_974._4_4_; local_658 = local_658 + 1
                            ) {
                          dVar1 = *(double *)
                                   (local_bd0 +
                                   ((long)(iVar13 - local_bb0) + (local_658 - local_bac) * local_bc8
                                   + (local_654 - local_ba8) * local_bc0) * 8);
                          local_648 = dVar1 * *(double *)
                                               (*local_ac8 +
                                               ((long)(iVar13 - (int)local_ac8[4]) +
                                                (long)(local_658 - *(int *)((long)local_ac8 + 0x24))
                                                * local_ac8[1] +
                                                (long)(local_654 - (int)local_ac8[5]) * local_ac8[2]
                                               + (long)local_63c * local_ac8[3]) * 8) + local_648;
                          local_650 = dVar1 + local_650;
                        }
                      }
                      if (local_650 <= 1e-30) {
                        *(undefined8 *)
                         (*local_a80 +
                         ((long)(local_c1c - (int)local_a80[4]) +
                          (long)(local_c18 - *(int *)((long)local_a80 + 0x24)) * local_a80[1] +
                          (long)(local_c14 - (int)local_a80[5]) * local_a80[2] +
                         (long)local_63c * local_a80[3]) * 8) =
                             *(undefined8 *)
                              (*local_ac8 +
                              ((long)(iVar13 - (int)local_ac8[4]) +
                               (long)(local_c18 * local_974._4_4_ - *(int *)((long)local_ac8 + 0x24)
                                     ) * local_ac8[1] +
                               (long)(local_c14 * ngcrse_00 - (int)local_ac8[5]) * local_ac8[2] +
                              (long)local_63c * local_ac8[3]) * 8);
                      }
                      else {
                        *(double *)
                         (*local_a80 +
                         ((long)(local_c1c - (int)local_a80[4]) +
                          (long)(local_c18 - *(int *)((long)local_a80 + 0x24)) * local_a80[1] +
                          (long)(local_c14 - (int)local_a80[5]) * local_a80[2] +
                         (long)local_63c * local_a80[3]) * 8) = local_648 / local_650;
                      }
                    }
                  }
                }
              }
            }
            else if (local_9b4 == 1) {
              iVar2 = *local_a38;
              iVar3 = local_a38[1];
              iVar4 = local_a38[3];
              iVar5 = local_a38[4];
              iVar6 = local_a38[5];
              for (local_c5c = local_a38[2]; local_c60 = iVar3, local_c5c <= iVar6;
                  local_c5c = local_c5c + 1) {
                for (; local_c64 = iVar2, local_c60 <= iVar5; local_c60 = local_c60 + 1) {
                  for (; local_c64 <= iVar4; local_c64 = local_c64 + 1) {
                    iVar13 = local_c60 * local_974._4_4_;
                    for (local_584 = 0; local_584 < (int)uVar12; local_584 = local_584 + 1) {
                      local_590 = 0.0;
                      local_598 = 0.0;
                      for (local_59c = local_c5c * ngcrse_00;
                          local_59c < (local_c5c + 1) * ngcrse_00; local_59c = local_59c + 1) {
                        for (local_5a0 = local_c64 * (int)local_974;
                            local_5a0 < (local_c64 + 1) * (int)local_974; local_5a0 = local_5a0 + 1)
                        {
                          dVar1 = *(double *)
                                   (local_bd0 +
                                   ((long)(local_5a0 - local_bb0) + (iVar13 - local_bac) * local_bc8
                                   + (local_59c - local_ba8) * local_bc0) * 8);
                          local_590 = dVar1 * *(double *)
                                               (*local_ac8 +
                                               ((long)(local_5a0 - (int)local_ac8[4]) +
                                                (long)(iVar13 - *(int *)((long)local_ac8 + 0x24)) *
                                                local_ac8[1] +
                                                (long)(local_59c - (int)local_ac8[5]) * local_ac8[2]
                                               + (long)local_584 * local_ac8[3]) * 8) + local_590;
                          local_598 = dVar1 + local_598;
                        }
                      }
                      if (local_598 <= 1e-30) {
                        *(undefined8 *)
                         (*local_a80 +
                         ((long)(local_c64 - (int)local_a80[4]) +
                          (long)(local_c60 - *(int *)((long)local_a80 + 0x24)) * local_a80[1] +
                          (long)(local_c5c - (int)local_a80[5]) * local_a80[2] +
                         (long)local_584 * local_a80[3]) * 8) =
                             *(undefined8 *)
                              (*local_ac8 +
                              ((long)(local_c64 * (int)local_974 - (int)local_ac8[4]) +
                               (long)(iVar13 - *(int *)((long)local_ac8 + 0x24)) * local_ac8[1] +
                               (long)(local_c5c * ngcrse_00 - (int)local_ac8[5]) * local_ac8[2] +
                              (long)local_584 * local_ac8[3]) * 8);
                      }
                      else {
                        *(double *)
                         (*local_a80 +
                         ((long)(local_c64 - (int)local_a80[4]) +
                          (long)(local_c60 - *(int *)((long)local_a80 + 0x24)) * local_a80[1] +
                          (long)(local_c5c - (int)local_a80[5]) * local_a80[2] +
                         (long)local_584 * local_a80[3]) * 8) = local_590 / local_598;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar2 = *local_a38;
              iVar3 = local_a38[1];
              iVar4 = local_a38[3];
              iVar5 = local_a38[4];
              iVar6 = local_a38[5];
              for (local_ca4 = local_a38[2]; local_ca8 = iVar3, local_ca4 <= iVar6;
                  local_ca4 = local_ca4 + 1) {
                for (; local_cac = iVar2, local_ca8 <= iVar5; local_ca8 = local_ca8 + 1) {
                  for (; local_cac <= iVar4; local_cac = local_cac + 1) {
                    iVar13 = local_ca4 * ngcrse_00;
                    for (local_4cc = 0; local_4cc < (int)uVar12; local_4cc = local_4cc + 1) {
                      local_4d8 = 0.0;
                      local_4e0 = 0.0;
                      for (local_4e4 = local_ca8 * local_974._4_4_;
                          local_4e4 < (local_ca8 + 1) * local_974._4_4_; local_4e4 = local_4e4 + 1)
                      {
                        for (local_4e8 = local_cac * (int)local_974;
                            local_4e8 < (local_cac + 1) * (int)local_974; local_4e8 = local_4e8 + 1)
                        {
                          dVar1 = *(double *)
                                   (local_bd0 +
                                   ((long)(local_4e8 - local_bb0) +
                                    (local_4e4 - local_bac) * local_bc8 +
                                   (iVar13 - local_ba8) * local_bc0) * 8);
                          local_4d8 = dVar1 * *(double *)
                                               (*local_ac8 +
                                               ((long)(local_4e8 - (int)local_ac8[4]) +
                                                (long)(local_4e4 - *(int *)((long)local_ac8 + 0x24))
                                                * local_ac8[1] +
                                                (long)(iVar13 - (int)local_ac8[5]) * local_ac8[2] +
                                               (long)local_4cc * local_ac8[3]) * 8) + local_4d8;
                          local_4e0 = dVar1 + local_4e0;
                        }
                      }
                      if (local_4e0 <= 1e-30) {
                        *(undefined8 *)
                         (*local_a80 +
                         ((long)(local_cac - (int)local_a80[4]) +
                          (long)(local_ca8 - *(int *)((long)local_a80 + 0x24)) * local_a80[1] +
                          (long)(local_ca4 - (int)local_a80[5]) * local_a80[2] +
                         (long)local_4cc * local_a80[3]) * 8) =
                             *(undefined8 *)
                              (*local_ac8 +
                              ((long)(local_cac * (int)local_974 - (int)local_ac8[4]) +
                               (long)(local_ca8 * local_974._4_4_ - *(int *)((long)local_ac8 + 0x24)
                                     ) * local_ac8[1] +
                               (long)(iVar13 - (int)local_ac8[5]) * local_ac8[2] +
                              (long)local_4cc * local_ac8[3]) * 8);
                      }
                      else {
                        *(double *)
                         (*local_a80 +
                         ((long)(local_cac - (int)local_a80[4]) +
                          (long)(local_ca8 - *(int *)((long)local_a80 + 0x24)) * local_a80[1] +
                          (long)(local_ca4 - (int)local_a80[5]) * local_a80[2] +
                         (long)local_4cc * local_a80[3]) * 8) = local_4d8 / local_4e0;
                      }
                    }
                  }
                }
              }
            }
          }
          MFIter::operator++(&local_a18);
        }
        MFIter::~MFIter((MFIter *)in_stack_ffffffffffffed60);
      }
    }
    else {
      std::array<amrex::MultiFab,_3UL>::array
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffed70);
      for (local_1134 = 0; local_1134 < 3; local_1134 = local_1134 + 1) {
        ppMVar16 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                             ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
                              (size_type)in_stack_ffffffffffffed58);
        FabArrayBase::boxArray((FabArrayBase *)*ppMVar16);
        BoxArray::BoxArray((BoxArray *)in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
        BoxArray::coarsen(in_stack_ffffffffffffeda8,(IntVect *)in_stack_ffffffffffffeda0);
        in_stack_ffffffffffffeda0 =
             std::array<amrex::MultiFab,_3UL>::operator[]
                       ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffed60,
                        (size_type)in_stack_ffffffffffffed58);
        ppMVar16 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                             ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
                              (size_type)in_stack_ffffffffffffed58);
        in_stack_ffffffffffffedb0 = uVar12;
        in_stack_ffffffffffffedb4 = in_ECX;
        in_stack_ffffffffffffeda8 =
             (BoxArray *)FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar16);
        local_11d0.m_op._20_8_ = 0;
        local_11d0.m_op._28_8_ = 0;
        local_11d0.m_op._4_8_ = 0;
        local_11d0.m_op._12_8_ = 0;
        local_11d0.m_op._36_8_ = 0;
        in_stack_ffffffffffffedb8 = (undefined1 *)((long)&local_11d0.m_op + 4);
        uVar12 = in_stack_ffffffffffffedb0;
        in_ECX = in_stack_ffffffffffffedb4;
        MFInfo::MFInfo((MFInfo *)0x13ecbd3);
        local_11d0._0_8_ = 0;
        in_stack_ffffffffffffed58 = (BoxArray *)&local_11d0;
        DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffed60);
        (*(in_stack_ffffffffffffeda0->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
          _vptr_FabArrayBase[2])
                  (in_stack_ffffffffffffeda0,(undefined1 *)((long)&local_11d0.m_op + 0x2c),
                   in_stack_ffffffffffffeda8,(ulong)in_stack_ffffffffffffedb0,
                   (ulong)in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb8);
        DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)0x13ecc34);
        MFInfo::~MFInfo((MFInfo *)0x13ecc41);
        BoxArray::~BoxArray((BoxArray *)in_stack_ffffffffffffed60);
      }
      GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffed60);
      EB_average_down_faces(in_RSI,in_RDX,(IntVect *)CONCAT44(in_ECX,uVar12),ngcrse_00);
      for (local_11ec = 0; local_11ec < 3; local_11ec = local_11ec + 1) {
        ppMVar14 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                             ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed60,
                              (size_type)in_stack_ffffffffffffed58);
        in_stack_ffffffffffffed70 = &(*ppMVar14)->super_FabArray<amrex::FArrayBox>;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffed60,
                   (size_type)in_stack_ffffffffffffed58);
        uVar17 = (undefined4)((ulong)in_stack_ffffffffffffed58 >> 0x20);
        uVar12 = in_ECX;
        in_stack_ffffffffffffed60 = (MultiCutFab *)Periodicity::NonPeriodic();
        in_stack_ffffffffffffed58 = (BoxArray *)CONCAT44(uVar17,in_ECX);
        FabArray<amrex::FArrayBox>::ParallelCopy
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                   in_stack_ffffffffffffedc0,(int)((ulong)in_stack_ffffffffffffedb8 >> 0x20),
                   (int)in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb4,
                   in_stack_ffffffffffffedb0,(int)in_stack_ffffffffffffede0,
                   (Periodicity *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                   (CpOp)in_stack_ffffffffffffedf0);
        in_ECX = uVar12;
      }
      std::array<amrex::MultiFab,_3UL>::~array
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffed70);
    }
  }
  else {
    average_down_faces((Array<const_MultiFab_*,_3> *)in_stack_ffffffffffffed70,
                       (Array<MultiFab_*,_3> *)
                       CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),
                       (IntVect *)in_stack_ffffffffffffed60,
                       (int)((ulong)in_stack_ffffffffffffed58 >> 0x20));
  }
  return;
}

Assistant:

void EB_average_down_faces (const Array<const MultiFab*,AMREX_SPACEDIM>& fine,
                            const Array<MultiFab*,AMREX_SPACEDIM>& crse,
                            const IntVect& ratio, int ngcrse)
{
    AMREX_ASSERT(crse[0]->nComp() == fine[0]->nComp());

    int ncomp = crse[0]->nComp();
    if (!(*fine[0]).hasEBFabFactory())
    {
        amrex::average_down_faces(fine, crse, ratio, ngcrse);
    }
    else
    {
        Dim3 dratio = ratio.dim3();

        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>((*fine[0]).Factory());
        const auto&  aspect = factory.getAreaFrac();

        if (isMFIterSafe(*fine[0], *crse[0]))
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (int n=0; n<AMREX_SPACEDIM; ++n) {
                for (MFIter mfi(*crse[n],TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const auto& flag_fab = amrex::getEBCellFlagFab((*fine[n])[mfi]);
                    const Box& tbx = mfi.growntilebox(ngcrse);
                    FabType typ = flag_fab.getType(amrex::refine(tbx,ratio));

                    Array4<Real> const& ca = crse[n]->array(mfi);
                    Array4<Real const> const& fa = fine[n]->const_array(mfi);

                    if(typ == FabType::regular || typ == FabType::covered)
                    {
                        AMREX_LAUNCH_HOST_DEVICE_LAMBDA(tbx, b,
                        {
                            amrex_avgdown_faces(b, ca, fa, 0, 0, ncomp, ratio, n);
                        });
                    }
                    else
                    {
                        Array4<Real const> const& ap = aspect[n]->const_array(mfi);
                        if (n == 0) {
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_x(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
                        } else if (n == 1) {
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_y(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
                        } else {
#if (AMREX_SPACEDIM == 3)
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_z(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
#endif
                        }
                    }
                }
            }
        }
        else
        {
            Array<MultiFab,AMREX_SPACEDIM> ctmp;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                BoxArray cba = fine[idim]->boxArray();
                cba.coarsen(ratio);
                ctmp[idim].define(cba, fine[idim]->DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            }
            EB_average_down_faces(fine, amrex::GetArrOfPtrs(ctmp), ratio, ngcrse);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                crse[idim]->ParallelCopy(ctmp[idim],0,0,ncomp,ngcrse,ngcrse);
            }
        }
    }
}